

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer pos;
  char *e;
  bool bVar4;
  char *res;
  char *pcStack_288;
  int anchor;
  char *s1;
  MatchState ms;
  char *s2;
  size_t init;
  char *p;
  char *s;
  size_t lp;
  size_t ls;
  lua_State *plStack_18;
  int find_local;
  lua_State *L_local;
  
  ls._4_4_ = find;
  plStack_18 = L;
  pcVar3 = luaL_checklstring(L,1,&lp);
  init = (size_t)luaL_checklstring(plStack_18,2,(size_t *)&s);
  pos = luaL_optinteger(plStack_18,3,1);
  s2 = (char *)posrelat(pos,lp);
  if (s2 == (char *)0x0) {
    s2 = (char *)0x1;
  }
  else if ((char *)(lp + 1) < s2) {
    lua_pushnil(plStack_18);
    return 1;
  }
  if ((ls._4_4_ == 0) ||
     ((iVar2 = lua_toboolean(plStack_18,4), iVar2 == 0 &&
      (iVar2 = nospecials((char *)init,(size_t)s), iVar2 == 0)))) {
    cVar1 = *(char *)init;
    if (cVar1 == '^') {
      init = init + 1;
      s = s + -1;
    }
    ms.p_end = (char *)plStack_18;
    s1._0_4_ = 200;
    ms.src_init = pcVar3 + lp;
    ms.src_end = s + init;
    pcStack_288 = pcVar3 + (long)s2 + -1;
    ms._0_8_ = pcVar3;
    do {
      ms.L._0_4_ = 0;
      e = match((MatchState *)&s1,pcStack_288,(char *)init);
      if (e != (char *)0x0) {
        if (ls._4_4_ != 0) {
          lua_pushinteger(plStack_18,(lua_Integer)(pcStack_288 + (1 - (long)pcVar3)));
          lua_pushinteger(plStack_18,(long)e - (long)pcVar3);
          iVar2 = push_captures((MatchState *)&s1,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures((MatchState *)&s1,pcStack_288,e);
        return iVar2;
      }
      bVar4 = pcStack_288 < ms.src_init;
      pcStack_288 = pcStack_288 + 1;
    } while (bVar4 && cVar1 != '^');
  }
  else {
    ms.capture[0x1f].len =
         (ptrdiff_t)lmemfind(pcVar3 + (long)s2 + -1,(lp - (long)s2) + 1,(char *)init,(size_t)s);
    if ((char *)ms.capture[0x1f].len != (char *)0x0) {
      lua_pushinteger(plStack_18,(lua_Integer)(ms.capture[0x1f].len + (1 - (long)pcVar3)));
      lua_pushinteger(plStack_18,(lua_Integer)(s + (ms.capture[0x1f].len - (long)pcVar3)));
      return 2;
    }
    ms.capture[0x1f].len = 0;
  }
  lua_pushnil(plStack_18);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelat(luaL_optinteger(L, 3, 1), ls);
  if (init < 1) init = 1;
  else if (init > ls + 1) {  /* start after string's end? */
    lua_pushnil(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init - 1, ls - init + 1, p, lp);
    if (s2) {
      lua_pushinteger(L, s2 - s + 1);
      lua_pushinteger(L, s2 - s + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init - 1;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    ms.L = L;
    ms.matchdepth = MAXCCALLS;
    ms.src_init = s;
    ms.src_end = s + ls;
    ms.p_end = p + lp;
    do {
      const char *res;
      ms.level = 0;
      lua_assert(ms.matchdepth == MAXCCALLS);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1 - s + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}